

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.c
# Opt level: O2

_Bool matching_test_exists(char *test_name,CgreenVector *tests)

{
  TestItem *test_item;
  int iVar1;
  _Bool _Var2;
  int iVar3;
  int iVar4;
  
  iVar1 = 0;
  do {
    iVar4 = iVar1;
    iVar3 = cgreen_vector_size(tests);
    if (iVar3 <= iVar4) break;
    test_item = (TestItem *)cgreen_vector_get(tests,iVar4);
    _Var2 = test_matches_pattern(test_name,test_item);
    iVar1 = iVar4 + 1;
  } while (!_Var2);
  return iVar4 < iVar3;
}

Assistant:

static bool matching_test_exists(const char *test_name, CgreenVector *tests) {
    for (int i = 0; i<cgreen_vector_size(tests); i++)
        if (test_matches_pattern(test_name, get_item_from(tests, i))) {
            return true;
        }
    return false;
}